

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_custom_request
              (LIBSSH2_CHANNEL *channel,int want_reply,char *request_type,uint request_type_len,
              char *data,uint data_len)

{
  uchar uVar1;
  libssh2_nonblocking_states lVar2;
  LIBSSH2_SESSION *session;
  int iVar3;
  int iVar4;
  time_t start_time;
  uchar *puVar5;
  char *errmsg;
  size_t sVar6;
  undefined4 in_register_0000008c;
  uchar *data_1;
  size_t local_78;
  ulong local_70;
  uchar *local_68;
  time_t local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  char *local_40;
  ulong local_38;
  
  local_70 = CONCAT44(in_register_0000008c,data_len);
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_48 = data;
    local_40 = request_type;
    start_time = time((time_t *)0x0);
    local_38 = (ulong)(request_type_len + (int)local_70 + 10);
    local_58 = local_70 & 0xffffffff;
    local_68 = channel->channel_custom_local_channel;
    local_50 = (ulong)request_type_len;
    do {
      session = channel->session;
      lVar2 = channel->channel_custom_state;
      if (lVar2 == libssh2_NB_state_sent) {
LAB_0010ad6c:
        if (want_reply == 0) {
          channel->channel_custom_state = libssh2_NB_state_idle;
          return 0;
        }
        data_1 = (uchar *)0x0;
        local_78 = 0;
        iVar4 = _libssh2_packet_requirev
                          (session,"cd",&data_1,&local_78,1,local_68,4,
                           &channel->channel_custom_packet_requirev_state);
        if (iVar4 != -0x25) {
          iVar3 = -0xe;
          if (iVar4 == 0) {
            if (local_78 == 0) {
              iVar3 = -0x16;
              if (data_1 != (uchar *)0x0) {
                (*session->free)(data_1,&session->abstract);
                iVar3 = -0x16;
              }
              goto LAB_0010ae2a;
            }
            uVar1 = *data_1;
            local_60 = start_time;
            (*session->free)(data_1,&session->abstract);
            channel->channel_custom_state = libssh2_NB_state_idle;
            iVar4 = 0;
            iVar3 = -0x16;
            start_time = local_60;
            if (uVar1 == 'c') goto LAB_0010ae42;
          }
          else {
LAB_0010ae2a:
            channel->channel_custom_state = libssh2_NB_state_idle;
          }
          errmsg = "Failed custom channel request";
LAB_0010ae3d:
          iVar4 = _libssh2_error(session,iVar3,errmsg);
        }
LAB_0010ae42:
        if (iVar4 != -0x25) {
          return iVar4;
        }
      }
      else {
        if (lVar2 != libssh2_NB_state_created) {
          if (lVar2 == libssh2_NB_state_idle) {
            channel->channel_custom_packet_len = local_38;
            (channel->channel_custom_packet_requirev_state).start = 0;
            sVar6 = local_38;
            if (channel->channel_custom_packet != (uchar *)0x0) {
              (*session->free)(channel->channel_custom_packet,&session->abstract);
              sVar6 = channel->channel_custom_packet_len;
            }
            puVar5 = (uchar *)(*session->alloc)(sVar6,&session->abstract);
            channel->channel_custom_packet = puVar5;
            if (puVar5 != (uchar *)0x0) {
              data_1 = puVar5 + 1;
              *puVar5 = 'b';
              _libssh2_store_u32(&data_1,(channel->remote).id);
              _libssh2_store_str(&data_1,local_40,local_50);
              puVar5 = data_1 + 1;
              *data_1 = (uchar)want_reply;
              data_1 = puVar5;
              if ((int)local_70 != 0) {
                memcpy(puVar5,local_48,local_58);
              }
              channel->channel_custom_state = libssh2_NB_state_created;
              goto LAB_0010acfe;
            }
            iVar3 = -6;
            errmsg = "Unable to allocate memory for custom channel request";
          }
          else {
            iVar3 = -0x16;
            errmsg = "Unable to complete custom channel request";
          }
          goto LAB_0010ae3d;
        }
LAB_0010acfe:
        iVar3 = _libssh2_transport_send
                          (session,channel->channel_custom_packet,channel->channel_custom_packet_len
                           ,(uchar *)0x0,0);
        if (iVar3 == 0) {
          _libssh2_htonu32(local_68,(channel->local).id);
          channel->channel_custom_state = libssh2_NB_state_sent;
          goto LAB_0010ad6c;
        }
        if (iVar3 != -0x25) {
          channel->channel_custom_state = libssh2_NB_state_idle;
          errmsg = "Unable to send custom channel request packet";
          goto LAB_0010ae3d;
        }
        _libssh2_error(session,-0x25,"Would block sending custom channel request");
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

static int channel_custom_request(LIBSSH2_CHANNEL *channel, int want_reply,
                                  const char *request_type, unsigned int request_type_len,
                                  const char *data, unsigned int data_len) {
    LIBSSH2_SESSION *session = channel->session;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    int rc;

    if(channel->channel_custom_state == libssh2_NB_state_idle) {
        /* 10 = packet_type(1) + channel(4) + request_type_len(4) + want_reply(1) */
        channel->channel_custom_packet_len = 10 + request_type_len + data_len;

        /* Zero the whole thing out */
        memset(&channel->channel_custom_packet_requirev_state, 0,
               sizeof(channel->channel_custom_packet_requirev_state));

        /* make sure there isn't previous packet we would leak */
        if(channel->channel_custom_packet) {
            LIBSSH2_FREE(session, channel->channel_custom_packet);
        }

        /* allocate memory for packet */
        channel->channel_custom_packet =
            LIBSSH2_ALLOC(session, channel->channel_custom_packet_len);
        if(!channel->channel_custom_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for custom channel request");
        }

        /* compose packet */
        unsigned char *s = channel->channel_custom_packet;
        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, request_type, request_type_len);
        *(s++) = want_reply;
        if(data_len > 0) {
            memcpy(s, data, data_len);
        }

        channel->channel_custom_state = libssh2_NB_state_created;
    }

    if(channel->channel_custom_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, channel->channel_custom_packet,
                                     channel->channel_custom_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending custom channel request");
            return rc;
        }
        else if(rc) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send custom channel request packet");
        }
        _libssh2_htonu32(channel->channel_custom_local_channel, channel->local.id);
        channel->channel_custom_state = libssh2_NB_state_sent;
    }

    if(channel->channel_custom_state == libssh2_NB_state_sent) {
        if(!want_reply) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            return 0;
        }

        unsigned char *data = 0;
        size_t data_len = 0;
        unsigned char code = 0;

        rc = _libssh2_packet_requirev(
            session, reply_codes, &data, &data_len, 1,
            channel->channel_custom_local_channel,
            4, &channel->channel_custom_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            channel->channel_custom_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Failed custom channel request");
        }

        if(data_len >= 1) {
            code = data[0];
        }
        if(data) LIBSSH2_FREE(session, data);
        channel->channel_custom_state = libssh2_NB_state_idle;

        if(code == SSH_MSG_CHANNEL_SUCCESS) return 0;

        return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Failed custom channel request");
    }

    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete custom channel request");
}